

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O1

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
run_for<(Analyser::Static::PCCompatible::Target::Speed)0>
          (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
          Cycles duration)

{
  PIT *this_00;
  Cycles *pCVar1;
  int iVar2;
  WrappedInt<Cycles> WVar3;
  WrappedInt<Cycles> WVar4;
  int iVar5;
  int iVar6;
  
  WVar3.length_ = 0x7fffffff;
  if ((long)duration.super_WrappedInt<Cycles>.length_ < 0x7fffffff) {
    WVar3 = duration.super_WrappedInt<Cycles>.length_;
  }
  WVar4.length_ = -0x80000000;
  if (-0x80000000 < WVar3.length_) {
    WVar4.length_ = WVar3.length_;
  }
  iVar2 = this->cpu_divisor_;
  iVar5 = iVar2 + (int)WVar4.length_;
  iVar6 = iVar5 / 3;
  this->cpu_divisor_ = iVar5 % 3;
  if (4 < iVar2 + (int)WVar4.length_ + 2U) {
    this_00 = &this->pit_;
    do {
      i8253<false,_PCCompatible::PITObserver>::run_for(this_00,(Cycles)0x1);
      pCVar1 = &(this->speaker_).cycles_since_update;
      (pCVar1->super_WrappedInt<Cycles>).length_ = (pCVar1->super_WrappedInt<Cycles>).length_ + 1;
      i8253<false,_PCCompatible::PITObserver>::run_for(this_00,(Cycles)0x1);
      pCVar1 = &(this->speaker_).cycles_since_update;
      (pCVar1->super_WrappedInt<Cycles>).length_ = (pCVar1->super_WrappedInt<Cycles>).length_ + 1;
      i8253<false,_PCCompatible::PITObserver>::run_for(this_00,(Cycles)0x1);
      pCVar1 = &(this->speaker_).cycles_since_update;
      (pCVar1->super_WrappedInt<Cycles>).length_ = (pCVar1->super_WrappedInt<Cycles>).length_ + 1;
      iVar5 = (this->video_).full_clock_;
      iVar2 = iVar5 + 0x17417dc;
      (this->video_).full_clock_ = iVar2;
      iVar2 = iVar5 + (int)((ulong)((long)iVar2 * -0x3805d0cb) >> 0x20) + 0x17417dc;
      Motorola::CRTC::
      CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
      ::run_for(&(this->video_).crtc_,(Cycles)(long)((iVar2 >> 0x16) - (iVar2 >> 0x1f)));
      (this->video_).full_clock_ = (this->video_).full_clock_ % 0x51ede7;
      KeyboardController::run_for(&this->keyboard_,(Cycles)0x1);
      if ((((this->pic_).awaiting_eoi_ == false) &&
          ((~(this->pic_).mask_ & (this->pic_).requests_) != 0)) &&
         ((this->context).flags.interrupt_ != 0)) {
        if ((this->context).flow_controller.should_repeat_ == true) {
          (this->context).registers.ip_ = this->decoded_ip_;
          (this->context).flow_controller.should_repeat_ = false;
        }
        (this->context).flow_controller.halted_ = false;
        iVar2 = PIC::acknowledge(&this->pic_);
        InstructionSet::x86::
        interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                  (iVar2,&this->context);
      }
      if ((this->context).flow_controller.halted_ == false) {
        perform_instruction(this);
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

void run_for(const Cycles duration) {
			const auto pit_ticks = duration.as<int>();

			int ticks;
			if constexpr (speed == Target::Speed::Fast) {
				ticks = pit_ticks;
			} else {
				cpu_divisor_ += pit_ticks;
				ticks = cpu_divisor_ / 3;
				cpu_divisor_ %= 3;
			}

			while(ticks--) {
				//
				// First draft: all hardware runs in lockstep, as a multiple or divisor of the PIT frequency.
				//

				//
				// Advance the PIT and audio.
				//
				pit_.run_for(1);
				++speaker_.cycles_since_update;

				// For original speed, the CPU performs instructions at a 1/3rd divider of the PIT clock,
				// so run the PIT three times per 'tick'.
				if constexpr (speed == Target::Speed::ApproximatelyOriginal) {
					pit_.run_for(1);
					++speaker_.cycles_since_update;
					pit_.run_for(1);
					++speaker_.cycles_since_update;
				}

				//
				// Advance CRTC at a more approximate rate.
				//
				video_.run_for(speed == Target::Speed::Fast ? Cycles(1) : Cycles(3));

				//
				// Give the keyboard a notification of passing time; it's very approximately clocked,
				// really just including 'some' delays to avoid being instant.
				//
				keyboard_.run_for(Cycles(1));

				//
				// Perform one CPU instruction every three PIT cycles.
				// i.e. CPU instruction rate is 1/3 * ~1.19Mhz ~= 0.4 MIPS.
				//

				// Query for interrupts and apply if pending.
				if(pic_.pending() && context.flags.template flag<InstructionSet::x86::Flag::Interrupt>()) {
					// Regress the IP if a REP is in-progress so as to resume it later.
					if(context.flow_controller.should_repeat()) {
						context.registers.ip() = decoded_ip_;
						context.flow_controller.begin_instruction();
					}

					// Signal interrupt.
					context.flow_controller.unhalt();
					InstructionSet::x86::interrupt(
						pic_.acknowledge(),
						context
					);
				}

				// Do nothing if currently halted.
				if(context.flow_controller.halted()) {
					continue;
				}

				if constexpr (speed == Target::Speed::Fast) {
					// There's no divider applied, so this makes for 2*PIT = around 2.4 MIPS.
					// That's broadly 80286 speed, if MIPS were a valid measure.
					perform_instruction();
					perform_instruction();
				} else {
					// With the clock divider above, this makes for a net of PIT/3 = around 0.4 MIPS.
					// i.e. a shade more than 8086 speed, if MIPS were meaningful.
					perform_instruction();
				}

				// Other inevitably broad and fuzzy and inconsistent MIPS counts for my own potential future play:
				//
				// 80386 @ 20Mhz: 4–5 MIPS.
				// 80486 @ 66Mhz: 25 MIPS.
				// Pentium @ 100Mhz: 188 MIPS.
			}
		}